

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_compressEnd_public
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize)

{
  uint uVar1;
  size_t code;
  size_t code_00;
  ZSTD_CCtx *in_RCX;
  void *in_RDX;
  size_t in_RSI;
  ZSTD_CCtx *in_RDI;
  void *in_R8;
  size_t err_code_1;
  size_t err_code;
  size_t cSize;
  size_t endResult;
  size_t in_stack_ffffffffffffffc8;
  size_t extraCSize;
  ZSTD_CCtx *in_stack_fffffffffffffff8;
  
  code = ZSTD_compressContinue_internal
                   (in_stack_fffffffffffffff8,in_RDI,in_RSI,in_RDX,(size_t)in_RCX,
                    (U32)((ulong)in_R8 >> 0x20),(U32)err_code);
  uVar1 = ERR_isError(code);
  code_00 = code;
  if (uVar1 == 0) {
    code_00 = ZSTD_writeEpilogue(in_RCX,in_R8,in_stack_ffffffffffffffc8);
    extraCSize = code_00;
    uVar1 = ERR_isError(code_00);
    if (uVar1 == 0) {
      if (((in_RDI->appliedParams).fParams.contentSizeFlag != 0) &&
         (in_RDI->pledgedSrcSizePlusOne == 0)) {
        __assert_fail("!(cctx->appliedParams.fParams.contentSizeFlag && cctx->pledgedSrcSizePlusOne == 0)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x64f5,
                      "size_t ZSTD_compressEnd_public(ZSTD_CCtx *, void *, size_t, const void *, size_t)"
                     );
      }
      if ((in_RDI->pledgedSrcSizePlusOne == 0) ||
         (in_RDI->pledgedSrcSizePlusOne == in_RDI->consumedSrcSize + 1)) {
        ZSTD_CCtx_trace(in_RDI,extraCSize);
        code_00 = code + extraCSize;
      }
      else {
        code_00 = 0xffffffffffffffb8;
      }
    }
  }
  return code_00;
}

Assistant:

size_t ZSTD_compressEnd_public(ZSTD_CCtx* cctx,
                               void* dst, size_t dstCapacity,
                         const void* src, size_t srcSize)
{
    size_t endResult;
    size_t const cSize = ZSTD_compressContinue_internal(cctx,
                                dst, dstCapacity, src, srcSize,
                                1 /* frame mode */, 1 /* last chunk */);
    FORWARD_IF_ERROR(cSize, "ZSTD_compressContinue_internal failed");
    endResult = ZSTD_writeEpilogue(cctx, (char*)dst + cSize, dstCapacity-cSize);
    FORWARD_IF_ERROR(endResult, "ZSTD_writeEpilogue failed");
    assert(!(cctx->appliedParams.fParams.contentSizeFlag && cctx->pledgedSrcSizePlusOne == 0));
    if (cctx->pledgedSrcSizePlusOne != 0) {  /* control src size */
        ZSTD_STATIC_ASSERT(ZSTD_CONTENTSIZE_UNKNOWN == (unsigned long long)-1);
        DEBUGLOG(4, "end of frame : controlling src size");
        RETURN_ERROR_IF(
            cctx->pledgedSrcSizePlusOne != cctx->consumedSrcSize+1,
            srcSize_wrong,
             "error : pledgedSrcSize = %u, while realSrcSize = %u",
            (unsigned)cctx->pledgedSrcSizePlusOne-1,
            (unsigned)cctx->consumedSrcSize);
    }
    ZSTD_CCtx_trace(cctx, endResult);
    return cSize + endResult;
}